

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O1

int bsp_find_closest_points(void *handle,float *point,float radius,int **pointarray)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bsp_tree *tree;
  float fVar5;
  float fVar6;
  float fVar7;
  
  _bsp_add_points(*(bsp_node **)((long)handle + 0x10),point,(uint)*(byte *)((long)handle + 8),radius
                  ,pointarray);
  uVar1 = array_count(*pointarray);
  if ((int)uVar1 < 1) {
    iVar2 = -1;
  }
  else {
    iVar2 = -1;
    fVar5 = 3.4028235e+38;
    uVar3 = 0;
    do {
      if ((ulong)*(byte *)((long)handle + 8) == 0) {
        fVar6 = 0.0;
      }
      else {
        fVar6 = 0.0;
        uVar4 = 0;
        do {
          fVar7 = point[uVar4] -
                  *(float *)(*(long *)(*handle + uVar4 * 8) + (long)(*pointarray)[uVar3] * 4);
          fVar6 = fVar6 + fVar7 * fVar7;
          uVar4 = uVar4 + 1;
        } while (*(byte *)((long)handle + 8) != uVar4);
      }
      if (fVar6 < fVar5) {
        iVar2 = (*pointarray)[uVar3];
        fVar5 = fVar6;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar1);
  }
  return iVar2;
}

Assistant:

int
bsp_find_closest_points(
    void * handle,
    float * point,
    float radius,
    int ** pointarray )
{
    bsp_tree * tree;
    int d, i, cnt, closest;
    float bestradius;

    tree = (bsp_tree *) handle;
    assert( tree != NULL );

    bsp_find_points( tree, point, radius, pointarray );

    cnt = array_count( pointarray[0] );
    closest = -1;
    bestradius = FLT_MAX;
    for ( i = 0; i < cnt; i++ ) {
        radius = 0.0f;
        for ( d = 0; d < tree->dimensions; d++ ) {
            float diff;
            diff = point[d] - tree->pointarrays[d][pointarray[0][i]];
            radius += diff * diff;
        }
        if ( radius < bestradius ) {
            closest = pointarray[0][i];
            bestradius = radius;
        }
    }

    return closest;
}